

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_decoder.cpp
# Opt level: O3

void __thiscall
duckdb::DictionaryDecoder::InitializeDictionary
          (DictionaryDecoder *this,idx_t new_dictionary_size,
          optional_ptr<const_duckdb::TableFilter,_true> filter,
          optional_ptr<duckdb::TableFilterState,_true> filter_state,bool has_defines)

{
  SelectionVector *pSVar1;
  ulong uVar2;
  _Head_base<0UL,_bool_*,_false> _Var3;
  ParquetColumnSchema *pPVar4;
  _Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_> __ptr;
  ParquetReader *pPVar5;
  pointer pcVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ColumnReader *pCVar8;
  idx_t iVar9;
  byte bVar10;
  sel_t *psVar11;
  optional_ptr<const_duckdb::TableFilter,_true> oVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  char cVar15;
  bool bVar16;
  pointer pVVar17;
  _Head_base<0UL,_duckdb::Vector_*,_false> this_00;
  long *plVar18;
  type pVVar19;
  TemplatedValidityData<unsigned_long> *pTVar20;
  _Head_base<0UL,_unsigned_long_*,_false> _Var21;
  _Head_base<0UL,_bool_*,_false> __s;
  long *plVar22;
  ulong *puVar23;
  ulong uVar24;
  char cVar25;
  idx_t iVar26;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var27;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var28;
  idx_t iVar29;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var30;
  SelectionVector dict_sel;
  string __str_1;
  UnifiedVectorFormat vdata;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  SelectionVector local_118;
  long lStack_100;
  optional_ptr<duckdb::TableFilterState,_true> local_f8;
  optional_ptr<const_duckdb::TableFilter,_true> local_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_e8;
  uint local_e0;
  undefined4 uStack_dc;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8 [2];
  undefined1 local_c8 [24];
  element_type *peStack_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *local_80;
  TableFilter *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar2 = this->dictionary_size;
  _Var3._M_head_impl =
       (this->filter_result).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  this->dictionary_size = new_dictionary_size;
  (this->filter_result).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (bool *)0x0;
  local_f8.ptr = filter_state.ptr;
  local_f0.ptr = filter.ptr;
  if (_Var3._M_head_impl != (bool *)0x0) {
    operator_delete__(_Var3._M_head_impl);
  }
  this->filter_count = 0;
  this->can_have_nulls = has_defines;
  this_01 = &this->dictionary;
  if ((this->dictionary).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t
      .super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
      super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl == (Vector *)0x0) {
    iVar9 = this->dictionary_size;
    pPVar4 = this->reader->column_schema;
    this_00._M_head_impl = (Vector *)operator_new(0x68);
    LogicalType::LogicalType((LogicalType *)local_c8,&pPVar4->type);
    Vector::Vector(this_00._M_head_impl,(LogicalType *)local_c8,iVar9 + 1);
    local_118.sel_vector = (sel_t *)this_00._M_head_impl;
    LogicalType::~LogicalType((LogicalType *)local_c8);
    psVar11 = local_118.sel_vector;
    local_118.sel_vector = (sel_t *)0x0;
    __ptr.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
         (this_01->super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)._M_t.
         super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
         super__Head_base<0UL,_duckdb::Vector_*,_false>;
    (this_01->super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
    super__Head_base<0UL,_duckdb::Vector_*,_false> =
         (_Head_base<0UL,_duckdb::Vector_*,_false>)psVar11;
    if (__ptr.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl != (Vector *)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)this_01,
                 (Vector *)__ptr.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl);
      if ((Vector *)local_118.sel_vector != (Vector *)0x0) {
        ::std::default_delete<duckdb::Vector>::operator()
                  ((default_delete<duckdb::Vector> *)&local_118,(Vector *)local_118.sel_vector);
      }
    }
  }
  else if (uVar2 < this->dictionary_size) {
    pVVar17 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                        (this_01);
    Vector::Resize(pVVar17,uVar2,this->dictionary_size + 1);
  }
  pPVar5 = this->reader->reader;
  pcVar6 = (pPVar5->super_BaseFileReader).file.path._M_dataplus._M_p;
  local_50[0] = local_40;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar6,
             pcVar6 + (pPVar5->super_BaseFileReader).file.path._M_string_length);
  ::std::__cxx11::string::append((char *)local_50);
  plVar18 = (long *)::std::__cxx11::string::_M_append
                              ((char *)local_50,
                               (ulong)(this->reader->column_schema->name)._M_dataplus._M_p);
  local_70 = &local_60;
  plVar22 = plVar18 + 2;
  if ((long *)*plVar18 == plVar22) {
    local_60 = *plVar22;
    lStack_58 = plVar18[3];
  }
  else {
    local_60 = *plVar22;
    local_70 = (long *)*plVar18;
  }
  local_68 = plVar18[1];
  *plVar18 = (long)plVar22;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  plVar18 = (long *)::std::__cxx11::string::append((char *)&local_70);
  p_Var30 = &local_118.selection_data.internal.
             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  puVar23 = (ulong *)(plVar18 + 2);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar18 ==
      (__shared_count<(__gnu_cxx::_Lock_policy)2> *)puVar23) {
    local_118.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar23;
    lStack_100 = plVar18[3];
    local_118.sel_vector = (sel_t *)p_Var30;
  }
  else {
    local_118.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar23;
    local_118.sel_vector = (sel_t *)*plVar18;
  }
  local_118.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)plVar18[1];
  *plVar18 = (long)puVar23;
  plVar18[1] = 0;
  *(undefined1 *)(plVar18 + 2) = 0;
  uVar2 = this->reader->chunk_read_offset;
  cVar25 = '\x01';
  if (9 < uVar2) {
    uVar24 = uVar2;
    cVar15 = '\x04';
    do {
      cVar25 = cVar15;
      if (uVar24 < 100) {
        cVar25 = cVar25 + -2;
        goto LAB_01c09013;
      }
      if (uVar24 < 1000) {
        cVar25 = cVar25 + -1;
        goto LAB_01c09013;
      }
      if (uVar24 < 10000) goto LAB_01c09013;
      bVar16 = 99999 < uVar24;
      uVar24 = uVar24 / 10000;
      cVar15 = cVar25 + '\x04';
    } while (bVar16);
    cVar25 = cVar25 + '\x01';
  }
LAB_01c09013:
  local_e8 = local_d8;
  local_78 = filter.ptr;
  ::std::__cxx11::string::_M_construct((ulong)&local_e8,cVar25);
  ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_e8,local_e0,uVar2);
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&((local_118.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   owned_data).allocator.ptr + CONCAT44(uStack_dc,local_e0));
  _Var27._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_118.sel_vector != p_Var30) {
    _Var27._M_pi = local_118.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
  }
  if (_Var27._M_pi < p_Var7) {
    p_Var28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
    if (local_e8 != local_d8) {
      p_Var28 = local_d8[0];
    }
    if (p_Var7 <= p_Var28) {
      plVar18 = (long *)::std::__cxx11::string::replace
                                  ((ulong)&local_e8,0,(char *)0x0,(ulong)local_118.sel_vector);
      goto LAB_01c0909d;
    }
  }
  plVar18 = (long *)::std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_e8);
LAB_01c0909d:
  local_c8._0_8_ = local_c8 + 0x10;
  pSVar1 = (SelectionVector *)(plVar18 + 2);
  if ((SelectionVector *)*plVar18 == pSVar1) {
    local_c8._16_8_ =
         (((unsafe_unique_array<unsigned_long> *)&pSVar1->sel_vector)->
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
    peStack_b0 = (element_type *)plVar18[3];
  }
  else {
    local_c8._16_8_ =
         (((unsafe_unique_array<unsigned_long> *)&pSVar1->sel_vector)->
         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
    local_c8._0_8_ = (SelectionVector *)*plVar18;
  }
  local_c8._8_8_ = plVar18[1];
  *plVar18 = (long)pSVar1;
  plVar18[1] = 0;
  *(undefined1 *)
   &(((unsafe_unique_array<unsigned_long> *)&pSVar1->sel_vector)->
    super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
    super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t = 0;
  ::std::__cxx11::string::operator=((string *)&this->dictionary_id,(string *)local_c8);
  if ((SelectionVector *)local_c8._0_8_ != (SelectionVector *)(local_c8 + 0x10)) {
    operator_delete((void *)local_c8._0_8_);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_118.sel_vector != p_Var30) {
    operator_delete(local_118.sel_vector);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  pVVar19 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                      (this_01);
  FlatVector::VerifyFlatVector(pVVar19);
  p_Var30 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this->dictionary_size + 1);
  (pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
       (unsigned_long *)0x0;
  (pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  p_Var7 = (pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  (pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)p_Var30;
  if (this->can_have_nulls == true) {
    uVar2 = this->dictionary_size;
    _Var21._M_head_impl =
         (pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    local_80 = this_01;
    if (_Var21._M_head_impl == (unsigned_long *)0x0) {
      local_118.sel_vector = (sel_t *)p_Var30;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)local_c8,(unsigned_long *)&local_118);
      uVar14 = local_c8._8_8_;
      uVar13 = local_c8._0_8_;
      local_c8._0_8_ = (SelectionVector *)0x0;
      local_c8._8_8_ = (element_type *)0x0;
      p_Var7 = (pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar13;
      (pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar14;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
        if ((element_type *)local_c8._8_8_ != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
        }
      }
      pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data);
      _Var21._M_head_impl =
           (pTVar20->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      (pVVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           _Var21._M_head_impl;
    }
    bVar10 = (byte)uVar2 & 0x3f;
    _Var21._M_head_impl[uVar2 >> 6] =
         _Var21._M_head_impl[uVar2 >> 6] & (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
    this_01 = local_80;
  }
  pCVar8 = this->reader;
  iVar9 = this->dictionary_size;
  pVVar19 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                      (this_01);
  (*pCVar8->_vptr_ColumnReader[0xf])(pCVar8,&pCVar8->block,0,iVar9,0,pVVar19);
  if (local_78 != (TableFilter *)0x0) {
    optional_ptr<const_duckdb::TableFilter,_true>::CheckValid(&local_f0);
    oVar12.ptr = local_f0.ptr;
    optional_ptr<duckdb::TableFilterState,_true>::CheckValid(&local_f8);
    if (this->dictionary_size != 0) {
      bVar16 = DictionarySupportsFilter(this,oVar12.ptr,local_f8.ptr);
      if (bVar16) {
        uVar2 = this->dictionary_size;
        __s._M_head_impl = (bool *)operator_new__(uVar2);
        switchD_01043a80::default(__s._M_head_impl,0,uVar2);
        _Var3._M_head_impl =
             (this->filter_result).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
             super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
             super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
             super__Head_base<0UL,_bool_*,_false>._M_head_impl;
        (this->filter_result).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
        super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
        super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
        super__Head_base<0UL,_bool_*,_false>._M_head_impl = __s._M_head_impl;
        if (_Var3._M_head_impl != (bool *)0x0) {
          operator_delete__(_Var3._M_head_impl);
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_c8);
        pVVar17 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                            (this_01);
        Vector::ToUnifiedFormat(pVVar17,this->dictionary_size,(UnifiedVectorFormat *)local_c8);
        local_118.sel_vector = (sel_t *)0x0;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this->filter_count = this->dictionary_size;
        pVVar19 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            (this_01);
        optional_ptr<const_duckdb::TableFilter,_true>::CheckValid(&local_f0);
        oVar12.ptr = local_f0.ptr;
        optional_ptr<duckdb::TableFilterState,_true>::CheckValid(&local_f8);
        ColumnSegment::FilterSelection
                  (&local_118,pVVar19,(UnifiedVectorFormat *)local_c8,oVar12.ptr,local_f8.ptr,
                   this->dictionary_size,&this->filter_count);
        iVar9 = this->filter_count;
        if (iVar9 != 0) {
          _Var3._M_head_impl =
               (this->filter_result).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
               super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
               super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
               super__Head_base<0UL,_bool_*,_false>._M_head_impl;
          iVar26 = 0;
          do {
            iVar29 = iVar26;
            if (local_118.sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)local_118.sel_vector[iVar26];
            }
            _Var3._M_head_impl[iVar29] = true;
            iVar26 = iVar26 + 1;
          } while (iVar9 != iVar26);
        }
        if (local_118.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_118.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
        }
        if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
        }
      }
    }
  }
  return;
}

Assistant:

void DictionaryDecoder::InitializeDictionary(idx_t new_dictionary_size, optional_ptr<const TableFilter> filter,
                                             optional_ptr<TableFilterState> filter_state, bool has_defines) {
	auto old_dict_size = dictionary_size;
	dictionary_size = new_dictionary_size;
	filter_result.reset();
	filter_count = 0;
	can_have_nulls = has_defines;
	// we use the first value in the dictionary to keep a NULL
	if (!dictionary) {
		dictionary = make_uniq<Vector>(reader.Type(), dictionary_size + 1);
	} else if (dictionary_size > old_dict_size) {
		dictionary->Resize(old_dict_size, dictionary_size + 1);
	}
	dictionary_id =
	    reader.reader.GetFileName() + "_" + reader.Schema().name + "_" + std::to_string(reader.chunk_read_offset);
	// we use the last entry as a NULL, dictionary vectors don't have a separate validity mask
	auto &dict_validity = FlatVector::Validity(*dictionary);
	dict_validity.Reset(dictionary_size + 1);
	if (can_have_nulls) {
		dict_validity.SetInvalid(dictionary_size);
	}
	reader.Plain(reader.block, nullptr, dictionary_size, 0, *dictionary);

	if (filter && CanFilter(*filter, *filter_state)) {
		// no filter result yet - apply filter to the dictionary
		// initialize the filter result - setting everything to false
		filter_result = make_unsafe_uniq_array<bool>(dictionary_size);

		// apply the filter
		UnifiedVectorFormat vdata;
		dictionary->ToUnifiedFormat(dictionary_size, vdata);
		SelectionVector dict_sel;
		filter_count = dictionary_size;
		ColumnSegment::FilterSelection(dict_sel, *dictionary, vdata, *filter, *filter_state, dictionary_size,
		                               filter_count);

		// now set all matching tuples to true
		for (idx_t i = 0; i < filter_count; i++) {
			auto idx = dict_sel.get_index(i);
			filter_result[idx] = true;
		}
	}
}